

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadtree.c
# Opt level: O3

void OrderTree(QuadTreeNode *Tree,int PostTree)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  long lVar7;
  
  if (Tree->Children == (QuadTreeNode *)0x0) {
    if (*(int **)((long)(&Tree->Bounder + 1) + ((ulong)(PostTree != 0) * 2 + 2) * 4) != (int *)0x0)
    {
      piVar5 = (int *)0x0;
      piVar3 = (int *)0x0;
      piVar6 = *(int **)((long)(&Tree->Bounder + 1) + ((ulong)(PostTree != 0) * 2 + 2) * 4);
      do {
        piVar4 = piVar3;
        piVar1 = piVar6;
        piVar2 = piVar5;
        if (piVar6[2] == 1) {
          piVar4 = piVar6;
          piVar1 = piVar5;
          piVar2 = piVar3;
        }
        piVar5 = piVar1;
        piVar1 = *(int **)piVar6;
        *(int **)piVar6 = piVar2;
        piVar3 = piVar4;
        piVar6 = piVar1;
      } while (piVar1 != (int *)0x0);
      *(int **)((long)(&Tree->Bounder + 1) + ((ulong)(PostTree != 0) * 2 + 2) * 4) = piVar4;
      piVar3 = (int *)((long)(&Tree->Bounder + 1) + ((ulong)(PostTree != 0) * 2 + 2) * 4);
      for (; piVar4 != (int *)0x0; piVar4 = *(int **)piVar4) {
        piVar3 = piVar4;
      }
      *(int **)piVar3 = piVar5;
    }
  }
  else {
    lVar7 = 0xd8;
    do {
      OrderTree((QuadTreeNode *)((long)(Tree->Children->Bounder).TL.Pos + lVar7),PostTree);
      lVar7 = lVar7 + -0x48;
    } while (lVar7 != -0x48);
  }
  return;
}

Assistant:

void OrderTree(struct QuadTreeNode *Tree, int PostTree)
{
   struct Container *Objects, *NonObjects, *P, *PNext, **ITree;
   int c = 4;

   if (Tree->Children) {
      while (c--)
         OrderTree(&Tree->Children[c], PostTree);
   } else {
      ITree = PostTree ? &Tree->PostContents : &Tree->Contents;

      if (*ITree) {
         /* separate object and non-oject lists */
         Objects = NonObjects = NULL;
         P = *ITree;
         while (P) {
            PNext = P->Next;

            if (P->Type == OBJECT) {
               P->Next = Objects;
               Objects = P;
            } else {
               P->Next = NonObjects;
               NonObjects = P;
            }

            P = PNext;
         }

         /* now reintegrate lists - objects then non-objects */
         *ITree = Objects;
         while (*ITree)
            ITree = &(*ITree)->Next;
         *ITree = NonObjects;
      }
   }
}